

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.cpp
# Opt level: O2

void __thiscall column::column(column *this,string *name,string *flag,int size)

{
  bool bVar1;
  
  this->col_offset = 0;
  this->element_size = 0;
  this->element_truesize = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->flag)._M_dataplus._M_p = (pointer)&(this->flag).field_2;
  (this->flag)._M_string_length = 0;
  (this->flag).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->flag);
  bVar1 = std::operator==(flag,"INT");
  this->element_truesize = (uint)!bVar1 + size;
  this->element_size = size;
  return;
}

Assistant:

column::column(const string &name, const string &flag, int size){
    this->name = name;
    this->flag = flag;
    if(flag == "INT")
        element_truesize = size;
    else
        element_truesize = size + 1;
    element_size = size;
}